

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O1

void __thiscall disruptor::test::BusySpinStrategy::WaitForCursor::test_method(WaitForCursor *this)

{
  thread waiter;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  __atomic_base<long> **local_100;
  __atomic_base<long> local_f8;
  atomic<long> return_value;
  undefined8 *local_e8;
  __atomic_base<long> *local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined8 *local_c8;
  undefined8 **local_c0;
  undefined1 local_b8;
  undefined8 local_b0;
  shared_count sStack_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  return_value.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  waiter._M_id._M_thread = (id)0;
  local_118 = (undefined **)operator_new(0x18);
  *local_118 = (undefined *)&PTR___State_0011c5e8;
  local_118[1] = (undefined *)this;
  local_118[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter,&local_118,0);
  if (local_118 != (undefined **)0x0) {
    (**(code **)(*local_118 + 8))();
  }
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x41);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_0011ccc8;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_e0 = &local_f8;
  local_f8 = return_value.super___atomic_base<long>._M_i;
  local_b8 = return_value.super___atomic_base<long>._M_i == -1;
  local_b0 = 0;
  sStack_a8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_98 = "";
  local_100 = &local_e0;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0011cd40;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_e8;
  local_e8 = &kInitialCursorValue;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_0011cd40;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_a8);
  local_d8 = (undefined **)0x0;
  local_118 = (undefined **)operator_new(0x10);
  *local_118 = (undefined *)&PTR___State_0011c648;
  local_118[1] = (undefined *)this;
  std::thread::_M_start_thread(&local_d8,&local_118,0);
  if (local_118 != (undefined **)0x0) {
    (**(code **)(*local_118 + 8))();
  }
  std::thread::join();
  if (local_d8 == (undefined **)0x0) {
    std::thread::join();
    local_80 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
    ;
    local_78 = "";
    local_90 = &boost::unit_test::basic_cstring<char_const>::null;
    local_88 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x47);
    local_68 = 0;
    local_70 = &PTR__lazy_ostream_0011ccc8;
    local_60 = &boost::unit_test::lazy_ostream::inst;
    local_58 = "";
    local_f8 = return_value.super___atomic_base<long>._M_i;
    local_b8 = return_value.super___atomic_base<long>._M_i == 0;
    local_b0 = 0;
    sStack_a8.pi_ = (sp_counted_base *)0x0;
    local_a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
    ;
    local_98 = "";
    local_e0 = &local_f8;
    local_110 = 0;
    local_118 = &PTR__lazy_ostream_0011cd40;
    local_108 = &boost::unit_test::lazy_ostream::inst;
    local_100 = &local_e0;
    local_e8 = &kFirstSequenceValue;
    local_d0 = 0;
    local_d8 = &PTR__lazy_ostream_0011cd40;
    local_c8 = &boost::unit_test::lazy_ostream::inst;
    local_c0 = &local_e8;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_a8);
    if (waiter._M_id._M_thread == 0) {
      return;
    }
    std::terminate();
  }
  std::terminate();
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(
        strategy.WaitFor(kFirstSequenceValue, cursor, dependents, alerted));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() {
    cursor.IncrementAndGet(1L);
    strategy.SignalAllWhenBlocking();
  }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}